

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ModuleDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ModuleDeclarationSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ModuleHeaderSyntax&,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
          (BumpAllocator *this,SyntaxKind *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,ModuleHeaderSyntax *args_2,
          SyntaxList<slang::syntax::MemberSyntax> *args_3,Token *args_4,
          NamedBlockClauseSyntax **args_5)

{
  Token endmodule;
  ModuleDeclarationSyntax *this_00;
  
  this_00 = (ModuleDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModuleDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (ModuleDeclarationSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  endmodule.kind = args_4->kind;
  endmodule._2_1_ = args_4->field_0x2;
  endmodule.numFlags.raw = (args_4->numFlags).raw;
  endmodule.rawLen = args_4->rawLen;
  endmodule.info = args_4->info;
  syntax::ModuleDeclarationSyntax::ModuleDeclarationSyntax
            (this_00,*args,args_1,args_2,args_3,endmodule,*args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }